

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_4,_4>_>::doExecute
          (VariableStatement<tcu::Matrix<float,_4,_4>_> *this,EvalContext *ctx)

{
  Environment *pEVar1;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar2;
  Expr<tcu::Matrix<float,_4,_4>_> *pEVar3;
  IVal *this_00;
  IVal local_328;
  IVal local_198;
  EvalContext *local_18;
  EvalContext *ctx_local;
  VariableStatement<tcu::Matrix<float,_4,_4>_> *this_local;
  
  local_18 = ctx;
  ctx_local = (EvalContext *)this;
  if ((this->m_isDeclaration & 1U) == 0) {
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
                           *)&this->m_value);
    Expr<tcu::Matrix<float,_4,_4>_>::evaluate(&local_328,pEVar3,local_18);
    pEVar1 = local_18->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             ::operator*(&(this->m_variable).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                        );
    this_00 = Environment::lookup<tcu::Matrix<float,4,4>>(pEVar1,pVVar2);
    tcu::Matrix<tcu::Interval,_4,_4>::operator=(this_00,&local_328);
    tcu::Matrix<tcu::Interval,_4,_4>::~Matrix(&local_328);
  }
  else {
    pEVar1 = ctx->env;
    pVVar2 = de::
             SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             ::operator*(&(this->m_variable).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                        );
    pEVar3 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
             ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_4>_>_>
                           *)&this->m_value);
    Expr<tcu::Matrix<float,_4,_4>_>::evaluate(&local_198,pEVar3,local_18);
    Environment::bind<tcu::Matrix<float,4,4>>(pEVar1,pVVar2,&local_198);
    tcu::Matrix<tcu::Interval,_4,_4>::~Matrix(&local_198);
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}